

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFVW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Vector local_a0;
  Vector local_78;
  WorldCoordinates local_60;
  WorldCoordinates local_40;
  KFLOAT32 local_1c;
  WorldCoordinates *pWStack_18;
  KFLOAT32 totalTimeSinceReset_local;
  WorldCoordinates *PositionOut_local;
  DeadReckoningCalculator *this_local;
  
  local_1c = totalTimeSinceReset;
  pWStack_18 = PositionOut;
  PositionOut_local = &this->m_initPosition;
  DATA_TYPE::Vector::operator*(&local_78,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_60,&this->m_initPosition,&local_78);
  DATA_TYPE::Vector::operator*
            (&local_a0,&this->m_initLinearAcceleration,
             (KFLOAT64)((double)(float)local_1c * 0.5 * (double)(float)local_1c));
  DATA_TYPE::WorldCoordinates::operator+(&local_40,&local_60,&local_a0);
  DATA_TYPE::WorldCoordinates::operator=(pWStack_18,&local_40);
  DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_40);
  DATA_TYPE::Vector::~Vector(&local_a0);
  DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_60);
  DATA_TYPE::Vector::~Vector(&local_78);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFVW( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) +
                    ( m_initLinearAcceleration * ( 0.5 * totalTimeSinceReset * totalTimeSinceReset ) ) );
}